

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::
Attr_Decl_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval_internal
          (Attr_Decl_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this
          ,Dispatch_State *t_ss)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long lVar3;
  Dispatch_Engine *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  int iVar5;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  Boxed_Value BVar7;
  string attr_name;
  string class_name;
  bool local_f1;
  long *local_f0;
  long local_e8;
  long local_e0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  Dynamic_Object_Function *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a8;
  anon_class_32_1_15d86eb9_for_m_f local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Proxy_Function local_60 [2];
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_40;
  
  lVar2 = ((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.__align;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  lVar3 = *(long *)(lVar2 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,lVar3,*(long *)(lVar2 + 0x18) + lVar3);
  lVar2 = *(long *)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                           _M_rwlock + 8);
  local_f0 = local_e0;
  lVar3 = *(long *)(lVar2 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,lVar3,*(long *)(lVar2 + 0x18) + lVar3);
  this_00 = (Dispatch_Engine *)*in_RDX;
  local_d0 = &local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_f0,local_e8 + (long)local_f0);
  local_40.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(0x48);
  paVar1 = &local_a0.attr_name.field_2;
  if (local_d0 == &local_c0) {
    local_a0.attr_name.field_2._8_8_ = local_c0._8_8_;
    local_a0.attr_name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_a0.attr_name._M_dataplus._M_p = (pointer)local_d0;
  }
  local_a0.attr_name.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
  local_a0.attr_name.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
  local_a0.attr_name._M_string_length = local_c8;
  local_c8 = 0;
  local_c0._M_local_buf[0] = '\0';
  local_d0 = &local_c0;
  dispatch::
  Proxy_Function_Callable_Impl<chaiscript::Boxed_Value_(chaiscript::dispatch::Dynamic_Object_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/chaiscript_eval.hpp:1446:85)>
  ::Proxy_Function_Callable_Impl
            ((Proxy_Function_Callable_Impl<chaiscript::Boxed_Value_(chaiscript::dispatch::Dynamic_Object_&),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ChaiScript[P]ChaiScript_include_chaiscript_language_chaiscript_eval_hpp:1446:85)>
              *)local_40.
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr,&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::dispatch::Proxy_Function_Base*>
            (&local_40.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_40.
             super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.attr_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0.attr_name._M_dataplus._M_p,
                    local_a0.attr_name.field_2._M_allocated_capacity + 1);
  }
  local_f1 = true;
  local_b0 = (Dynamic_Object_Function *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::dispatch::detail::Dynamic_Object_Function,std::allocator<chaiscript::dispatch::detail::Dynamic_Object_Function>,std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,bool>
            (&_Stack_a8,&local_b0,
             (allocator<chaiscript::dispatch::detail::Dynamic_Object_Function> *)&local_a0,&local_80
             ,&local_40,&local_f1);
  local_60[0].
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_b0->super_Proxy_Function_Base;
  local_60[0].
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_a8._M_pi;
  local_b0 = (Dynamic_Object_Function *)0x0;
  _Stack_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  chaiscript::detail::Dispatch_Engine::add_function
            (this_00,local_60,
             (string *)
             (*(long *)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                               _M_rwlock + 8) + 0x10));
  _Var6._M_pi = extraout_RDX;
  if (local_60[0].
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60[0].
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var6._M_pi = extraout_RDX_00;
  }
  if (_Stack_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a8._M_pi);
    _Var6._M_pi = extraout_RDX_01;
  }
  if (local_40.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var6._M_pi = extraout_RDX_02;
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0])
                             + 1);
    _Var6._M_pi = extraout_RDX_03;
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
    _Var6._M_pi = extraout_RDX_04;
  }
  if (void_var()::v == '\0') {
    iVar5 = __cxa_guard_acquire(&void_var()::v);
    _Var6._M_pi = extraout_RDX_06;
    if (iVar5 != 0) {
      Boxed_Value::Boxed_Value<chaiscript::Boxed_Value::Void_Type,void>
                (&void_var::v,(Void_Type *)&local_a0,false);
      __cxa_atexit(Boxed_Value::~Boxed_Value,&void_var::v,&__dso_handle);
      __cxa_guard_release(&void_var()::v);
      _Var6._M_pi = extraout_RDX_07;
    }
  }
  (this->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
  super_AST_Node._vptr_AST_Node =
       (_func_int **)
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var4 = void_var::v.m_data.
          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &(this->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
    super_AST_Node.identifier =
       void_var::v.m_data.
       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var4._M_pi)->_M_use_count = (_Var4._M_pi)->_M_use_count + 1;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    _Var6._M_pi = extraout_RDX_05;
  }
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        std::string class_name = this->children[0]->text;

        try {
          std::string attr_name = this->children[1]->text;

          t_ss->add(std::make_shared<dispatch::detail::Dynamic_Object_Function>(std::move(class_name),
                                                                                fun([attr_name](dispatch::Dynamic_Object &t_obj) {
                                                                                  return t_obj.get_attr(attr_name);
                                                                                }),
                                                                                true

                                                                                ),
                    this->children[1]->text);
        } catch (const exception::name_conflict_error &e) {
          throw exception::eval_error("Attribute redefined '" + e.name() + "'");
        }
        return void_var();
      }